

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool is_relative(char *path)

{
  size_t sVar1;
  char *in_RDI;
  char current_dir [260];
  char drive [260];
  char in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffdd9;
  char *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  _Bool local_1;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 == 0) {
    local_1 = true;
  }
  else {
    split_path(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
               (char *)CONCAT71(in_stack_fffffffffffffdd9,in_stack_fffffffffffffdd8),
               (char *)0x19548c);
    sVar1 = strlen(&stack0xfffffffffffffdd8);
    if (sVar1 == 0) {
      local_1 = true;
    }
    else if ((in_stack_fffffffffffffdd8 == *G_BACKSLASH_CHAR) ||
            (in_stack_fffffffffffffdd8 == *G_FORWARD_SLASH_CHAR)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool is_relative(const char *path)
{
	if (strlen(path) == 0)
	{
		return true;
	}
	char drive[MAX_PATH];
	char current_dir[MAX_PATH];
	split_path(path, drive, current_dir, NULL, NULL);
#if defined(_WIN32)
	if (strlen(drive) != 0)
	{
		return false;
	}
#endif
	if (strlen(current_dir) == 0)
	{
		return true;
	}
	if ((current_dir[0] != *G_BACKSLASH_CHAR) && (current_dir[0] != *G_FORWARD_SLASH_CHAR))
	{
		return true;
	}
	return false;
}